

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

shared_ptr<Pipeline> __thiscall
QPDFLogger::throwIfNull(QPDFLogger *this,shared_ptr<Pipeline> *p,bool null_okay)

{
  bool bVar1;
  logic_error *this_00;
  byte in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Pipeline> sVar2;
  bool null_okay_local;
  shared_ptr<Pipeline> *p_local;
  QPDFLogger *this_local;
  
  if ((in_CL & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)CONCAT71(in_register_00000011,null_okay));
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"QPDFLogger: requested a null pipeline without null_okay == true");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  std::shared_ptr<Pipeline>::shared_ptr
            ((shared_ptr<Pipeline> *)this,
             (shared_ptr<Pipeline> *)CONCAT71(in_register_00000011,null_okay));
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::throwIfNull(std::shared_ptr<Pipeline> p, bool null_okay)
{
    if (!(null_okay || p)) {
        throw std::logic_error("QPDFLogger: requested a null pipeline without null_okay == true");
    }
    return p;
}